

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  size_t *psVar1;
  internalJSONNode *piVar2;
  
  piVar2 = other->internal;
  if (this->internal != piVar2) {
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      internalJSONNode::deleteInternal(piVar2);
    }
    piVar2 = this->internal;
    psVar1 = &piVar2->refcount;
    *psVar1 = *psVar1 + 1;
    other->internal = piVar2;
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode * other) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (internal == other -> internal) return;
	   *other = *this;
    }